

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

Rational * __thiscall
soplex::SoPlexBase<double>::objValueRational
          (Rational *__return_storage_ptr__,SoPlexBase<double> *this)

{
  long lVar1;
  bool bVar2;
  
  if (this->_status == INFEASIBLE) {
    bVar2 = this->_currentSettings->_intParamValues[0] == 1;
  }
  else {
    if (this->_status != UNBOUNDED) {
      if ((this->_hasSolReal != false) || (lVar1 = 0x5160, (this->_hasSolRational & 1U) != 0)) {
        _syncRationalSolution(this);
        lVar1 = 0x4fa0;
      }
      goto LAB_00189ad5;
    }
    bVar2 = this->_currentSettings->_intParamValues[0] != 1;
  }
  lVar1 = (ulong)bVar2 * 0x40 + 0x40;
LAB_00189ad5:
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor(&__return_storage_ptr__->m_backend,
                     (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)((long)&this->_vptr_SoPlexBase + lVar1));
  return __return_storage_ptr__;
}

Assistant:

Rational SoPlexBase<R>::objValueRational()
{
   assert(OBJSENSE_MAXIMIZE == 1);
   assert(OBJSENSE_MINIMIZE == -1);

   if(this->status() == SPxSolverBase<R>::UNBOUNDED)
   {
      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MAXIMIZE)
         return _rationalPosInfty;
      else
         return _rationalNegInfty;
   }
   else if(this->status() == SPxSolverBase<R>::INFEASIBLE)
   {
      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MAXIMIZE)
         return _rationalNegInfty;
      else
         return _rationalPosInfty;
   }
   else if(hasSol())
   {
      _syncRationalSolution();
      return _solRational._objVal;
   }
   else
      return _rationalZero;
}